

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BSTreeTest.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  BSTree<int> *this;
  ostream *poVar1;
  BSTNode<int> *pBVar2;
  int *item;
  pointer piVar3;
  initializer_list<int> __l;
  allocator_type local_51;
  vector<int,_std::allocator<int>_> data;
  int local_38 [8];
  
  local_38[4] = 2;
  local_38[5] = 7;
  local_38[6] = 6;
  local_38[7] = 8;
  local_38[0] = 1;
  local_38[1] = 5;
  local_38[2] = 4;
  local_38[3] = 3;
  __l._M_len = 8;
  __l._M_array = local_38;
  std::vector<int,_std::allocator<int>_>::vector(&data,__l,&local_51);
  this = (BSTree<int> *)operator_new(8);
  this->mRoot = (BSTNode<int> *)0x0;
  for (piVar3 = data.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                _M_start;
      piVar3 != data.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                _M_finish; piVar3 = piVar3 + 1) {
    BSTree<int>::insert(this,*piVar3);
  }
  BSTree<int>::print(this);
  poVar1 = std::operator<<((ostream *)&std::cout,"====================================");
  std::endl<char,std::char_traits<char>>(poVar1);
  pBVar2 = BSTree<int>::maxmum(this);
  if (pBVar2 != (BSTNode<int> *)0x0) {
    poVar1 = std::operator<<((ostream *)&std::cout,"maxmum: ");
    pBVar2 = BSTree<int>::maxmum(this);
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,pBVar2->key);
    std::endl<char,std::char_traits<char>>(poVar1);
  }
  pBVar2 = BSTree<int>::minimum(this);
  if (pBVar2 != (BSTNode<int> *)0x0) {
    poVar1 = std::operator<<((ostream *)&std::cout,"minimum: ");
    pBVar2 = BSTree<int>::minimum(this);
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,pBVar2->key);
    std::endl<char,std::char_traits<char>>(poVar1);
  }
  poVar1 = std::operator<<((ostream *)&std::cout,"====================================");
  std::endl<char,std::char_traits<char>>(poVar1);
  BSTree<int>::preOrder(this);
  std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  poVar1 = std::operator<<((ostream *)&std::cout,"====================================");
  std::endl<char,std::char_traits<char>>(poVar1);
  BSTree<int>::inOrder(this);
  std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  poVar1 = std::operator<<((ostream *)&std::cout,"====================================");
  std::endl<char,std::char_traits<char>>(poVar1);
  BSTree<int>::postOrder(this);
  std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  poVar1 = std::operator<<((ostream *)&std::cout,"====================================");
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<((ostream *)&std::cout,"Test seach:");
  std::endl<char,std::char_traits<char>>(poVar1);
  pBVar2 = BSTree<int>::search(this,3);
  poVar1 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,pBVar2->key);
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<((ostream *)&std::cout,"====================================");
  std::endl<char,std::char_traits<char>>(poVar1);
  BSTree<int>::remove(this,(char *)0x5);
  BSTree<int>::print(this);
  BSTree<int>::~BSTree(this);
  operator_delete(this,8);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&data.super__Vector_base<int,_std::allocator<int>_>);
  return 0;
}

Assistant:

int main(int argc, char const *argv[])
{
	vector<int> data = {1, 5, 4, 3, 2, 7, 6, 8};
	BSTree<int>* tree =  new BSTree<int>();

	for (const auto& item : data)
		tree->insert(item);

	tree->print();

	cout << "====================================" << endl;
	if (tree->maxmum() != nullptr)
		cout << "maxmum: " << tree->maxmum()->key << endl;
	if (tree->minimum() != nullptr )
		cout << "minimum: " << tree->minimum()->key << endl;

	cout << "====================================" << endl;
	tree->preOrder();
	cout << endl;
	cout << "====================================" << endl;


	tree->inOrder();
	cout << endl;
	cout << "====================================" << endl;

	tree->postOrder();
	cout << endl;
	cout << "====================================" << endl;

	cout << "Test seach:" << endl;
	cout << tree->search(3)->key<< endl;
	cout << "====================================" << endl;

	tree->remove(5);
	tree->print();

	delete tree;

	return 0;
}